

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void __thiscall
tcu::astc::anon_unknown_0::AssignBlock128::setBits
          (AssignBlock128 *this,int low,int high,deUint32 bits)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  
  iVar2 = (high - low) + 1;
  if (iVar2 != 0) {
    iVar5 = low / 0x40;
    bVar4 = (byte)(low % 0x40);
    iVar1 = high / 0x40;
    if (iVar5 == iVar1) {
      this->m_words[iVar5] =
           (ulong)bits << (bVar4 & 0x3f) |
           ~(~(-1L << ((byte)iVar2 & 0x3f)) << (bVar4 & 0x3f)) & this->m_words[iVar5];
      return;
    }
    this->m_words[iVar5] =
         (ulong)bits << (bVar4 & 0x3f) | ~(-1L << (bVar4 & 0x3f)) & this->m_words[iVar5];
    bVar3 = (char)(high % 0x40) + 1;
    bVar4 = -bVar4;
    this->m_words[iVar1] =
         ((ulong)(bits >> (bVar4 & 0x3f)) << (bVar4 & 0x3f)) >> (bVar4 & 0x3f) |
         (this->m_words[iVar1] >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
  }
  return;
}

Assistant:

void setBits (int low, int high, deUint32 bits)
	{
		DE_ASSERT(de::inBounds(low, 0, 128));
		DE_ASSERT(de::inBounds(high, 0, 128));
		DE_ASSERT(de::inRange(high-low+1, 0, 32));
		DE_ASSERT((bits & (((Word)1 << (high-low+1)) - 1)) == bits);

		if (high-low+1 == 0)
			return;

		const int word0Ndx		= low / WORD_BITS;
		const int word1Ndx		= high / WORD_BITS;
		const int lowNdxInW0	= low % WORD_BITS;

		if (word0Ndx == word1Ndx)
			m_words[word0Ndx] = (m_words[word0Ndx] & ~((((Word)1 << (high-low+1)) - 1) << lowNdxInW0)) | ((Word)bits << lowNdxInW0);
		else
		{
			DE_ASSERT(word1Ndx == word0Ndx + 1);

			const int	highNdxInW1			= high % WORD_BITS;
			const int	numBitsToSetInW0	= WORD_BITS - lowNdxInW0;
			const Word	bitsLowMask			= ((Word)1 << numBitsToSetInW0) - 1;

			m_words[word0Ndx] = (m_words[word0Ndx] & (((Word)1 << lowNdxInW0) - 1))			| (((Word)bits & bitsLowMask) << lowNdxInW0);
			m_words[word1Ndx] = (m_words[word1Ndx] & ~(((Word)1 << (highNdxInW1+1)) - 1))	| (((Word)bits & ~bitsLowMask) >> numBitsToSetInW0);
		}
	}